

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyInternals.h
# Opt level: O0

btVector3 BaryCoord(btVector3 *a,btVector3 *b,btVector3 *c,btVector3 *p)

{
  btScalar isum;
  btScalar w [3];
  btVector3 *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  btScalar in_stack_ffffffffffffff24;
  btScalar in_stack_ffffffffffffff28;
  btScalar in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  btVector3 local_10;
  
  operator-((btVector3 *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
            (btVector3 *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  operator-((btVector3 *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
            (btVector3 *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  btCross((btVector3 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
          in_stack_ffffffffffffff18);
  btVector3::length((btVector3 *)0x281273);
  operator-((btVector3 *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
            (btVector3 *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  operator-((btVector3 *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
            (btVector3 *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  btCross((btVector3 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
          in_stack_ffffffffffffff18);
  btVector3::length((btVector3 *)0x2812e3);
  operator-((btVector3 *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
            (btVector3 *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  operator-((btVector3 *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
            (btVector3 *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  btCross((btVector3 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
          in_stack_ffffffffffffff18);
  btVector3::length((btVector3 *)0x281353);
  btVector3::btVector3
            (&local_10,(btScalar *)&stack0xffffffffffffff2c,(btScalar *)&stack0xffffffffffffff28,
             (btScalar *)&stack0xffffffffffffff24);
  return (btVector3)local_10.m_floats;
}

Assistant:

static inline btVector3		BaryCoord(	const btVector3& a,
									  const btVector3& b,
									  const btVector3& c,
									  const btVector3& p)
{
	const btScalar	w[]={	btCross(a-p,b-p).length(),
		btCross(b-p,c-p).length(),
		btCross(c-p,a-p).length()};
	const btScalar	isum=1/(w[0]+w[1]+w[2]);
	return(btVector3(w[1]*isum,w[2]*isum,w[0]*isum));
}